

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_opt_step_adamw(ggml_context *ctx,ggml_tensor *a,ggml_tensor *grad,ggml_tensor *m,ggml_tensor *v
                   ,ggml_tensor *adamw_params)

{
  _Bool _Var1;
  int64_t iVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  ggml_tensor *result;
  
  if ((in_RSI->flags & 4U) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1413,"GGML_ASSERT(%s) failed","a->flags & GGML_TENSOR_FLAG_PARAM");
  }
  _Var1 = ggml_are_same_shape(in_RSI,in_RDX);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1414,"GGML_ASSERT(%s) failed","ggml_are_same_shape(a, grad)");
  }
  _Var1 = ggml_are_same_shape(in_RSI,in_RCX);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1415,"GGML_ASSERT(%s) failed","ggml_are_same_shape(a, m)");
  }
  _Var1 = ggml_are_same_shape(in_RSI,in_R8);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1416,"GGML_ASSERT(%s) failed","ggml_are_same_shape(a, v)");
  }
  if (in_R9->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1417,"GGML_ASSERT(%s) failed","adamw_params->type == GGML_TYPE_F32");
  }
  iVar2 = ggml_nelements(in_R9);
  if (iVar2 != 7) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1418,"GGML_ASSERT(%s) failed","ggml_nelements(adamw_params) == 7");
  }
  pgVar3 = ggml_view_tensor((ggml_context *)in_RCX,in_R8);
  pgVar3->op = GGML_OP_OPT_STEP_ADAMW;
  pgVar3->src[0] = in_RSI;
  pgVar3->src[1] = in_RDX;
  pgVar3->src[2] = in_RCX;
  pgVar3->src[3] = in_R8;
  pgVar3->src[4] = in_R9;
  return pgVar3;
}

Assistant:

struct ggml_tensor * ggml_opt_step_adamw(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * grad,
        struct ggml_tensor  * m,
        struct ggml_tensor  * v,
        struct ggml_tensor  * adamw_params) {
    GGML_ASSERT(a->flags & GGML_TENSOR_FLAG_PARAM);
    GGML_ASSERT(ggml_are_same_shape(a, grad));
    GGML_ASSERT(ggml_are_same_shape(a, m));
    GGML_ASSERT(ggml_are_same_shape(a, v));
    GGML_ASSERT(adamw_params->type == GGML_TYPE_F32);
    GGML_ASSERT(ggml_nelements(adamw_params) == 7);

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    result->op     = GGML_OP_OPT_STEP_ADAMW;
    result->src[0] = a;
    result->src[1] = grad;
    result->src[2] = m;
    result->src[3] = v;
    result->src[4] = adamw_params;

    return result;
}